

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabel::setPixmap(QLabel *this,QPixmap *pixmap)

{
  optional<QIcon> *this_00;
  QLabelPrivate *this_01;
  bool bVar1;
  QIcon *pQVar2;
  long lVar3;
  long lVar4;
  QSize QVar5;
  long in_FS_OFFSET;
  undefined8 local_78;
  QSize local_70 [3];
  QSize local_58;
  QArrayDataPointer<QSize> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  this_00 = &this_01->icon;
  if ((this_01->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
      super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
      _M_engaged == true) {
    pQVar2 = std::_Optional_base_impl<QIcon,_std::_Optional_base<QIcon,_false,_false>_>::_M_get
                       ((_Optional_base_impl<QIcon,_std::_Optional_base<QIcon,_false,_false>_> *)
                        this_00);
    QIcon::availableSizes((Mode)&local_50,(State)pQVar2);
    local_58 = (QSize)QPixmap::size();
    bVar1 = QListSpecialMethodsBase<QSize>::contains<QSize>
                      ((QListSpecialMethodsBase<QSize> *)&local_50,&local_58);
    if (bVar1) {
      pQVar2 = std::_Optional_base_impl<QIcon,_std::_Optional_base<QIcon,_false,_false>_>::_M_get
                         ((_Optional_base_impl<QIcon,_std::_Optional_base<QIcon,_false,_false>_> *)
                          this_00);
      local_78 = QPixmap::size();
      QIcon::pixmap(local_70,(Mode)pQVar2,(State)&local_78);
      lVar3 = QPixmap::cacheKey();
      lVar4 = QPixmap::cacheKey();
      QPixmap::~QPixmap((QPixmap *)local_70);
      QArrayDataPointer<QSize>::~QArrayDataPointer(&local_50);
      if (lVar3 == lVar4) goto LAB_003e3453;
    }
    else {
      QArrayDataPointer<QSize>::~QArrayDataPointer(&local_50);
    }
  }
  QLabelPrivate::clearContents(this_01);
  QIcon::QIcon((QIcon *)&local_50,(QPixmap *)pixmap);
  std::optional<QIcon>::operator=(this_00,(QIcon *)&local_50);
  QIcon::~QIcon((QIcon *)&local_50);
  local_50.d = (Data *)QPixmap::deviceIndependentSize();
  QVar5 = QSizeF::toSize((QSizeF *)&local_50);
  this_01->pixmapSize = QVar5;
  QLabelPrivate::updateLabel(this_01);
LAB_003e3453:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabel::setPixmap(const QPixmap &pixmap)
{
    Q_D(QLabel);
    if (d->icon && d->icon->availableSizes().contains(pixmap.size()) &&
        d->icon->pixmap(pixmap.size()).cacheKey() == pixmap.cacheKey())
        return;
    d->clearContents();
    d->icon = QIcon(pixmap);
    d->pixmapSize = pixmap.deviceIndependentSize().toSize();
    d->updateLabel();
}